

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testInit
          (UniformBlockLayoutQualifierConflictTest *this)

{
  GLuint qualifier;
  QUALIFIERS QVar1;
  GLuint stage;
  STAGES SVar2;
  testCase test_case;
  value_type local_28;
  
  for (QVar1 = DEFAULT; QVar1 != QUALIFIERS_MAX; QVar1 = QVar1 + STD140) {
    for (SVar2 = COMPUTE; SVar2 != STAGE_MAX; SVar2 = SVar2 + VERTEX) {
      local_28.m_stage = SVar2;
      local_28.m_qualifier = QVar1;
      std::
      vector<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockLayoutQualifierConflictTest::testCase>_>
      ::push_back(&this->m_test_cases,&local_28);
    }
  }
  return;
}

Assistant:

void UniformBlockLayoutQualifierConflictTest::testInit()
{
	for (GLuint qualifier = 0; qualifier < QUALIFIERS_MAX; ++qualifier)
	{
		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			testCase test_case = { (QUALIFIERS)qualifier, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case);
		}
	}
}